

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O1

void __thiscall
cmRulePlaceholderExpander::cmRulePlaceholderExpander
          (cmRulePlaceholderExpander *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *compilers,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variableMappings,string *compilerSysroot,string *linkerSysroot)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->TargetImpLib)._M_dataplus._M_p = (pointer)&(this->TargetImpLib).field_2;
  (this->TargetImpLib)._M_string_length = 0;
  (this->TargetImpLib).field_2._M_local_buf[0] = '\0';
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->Compilers)._M_t._M_impl.super__Rb_tree_header,
             &(compilers->_M_t)._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header,
             &(variableMappings->_M_t)._M_impl.super__Rb_tree_header);
  paVar2 = &(this->CompilerSysroot).field_2;
  (this->CompilerSysroot)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (compilerSysroot->_M_dataplus)._M_p;
  paVar1 = &compilerSysroot->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&compilerSysroot->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->CompilerSysroot).field_2 + 8) = uVar4;
  }
  else {
    (this->CompilerSysroot)._M_dataplus._M_p = pcVar3;
    (this->CompilerSysroot).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->CompilerSysroot)._M_string_length = compilerSysroot->_M_string_length;
  (compilerSysroot->_M_dataplus)._M_p = (pointer)paVar1;
  compilerSysroot->_M_string_length = 0;
  (compilerSysroot->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->LinkerSysroot).field_2;
  (this->LinkerSysroot)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (linkerSysroot->_M_dataplus)._M_p;
  paVar1 = &linkerSysroot->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&linkerSysroot->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->LinkerSysroot).field_2 + 8) = uVar4;
  }
  else {
    (this->LinkerSysroot)._M_dataplus._M_p = pcVar3;
    (this->LinkerSysroot).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->LinkerSysroot)._M_string_length = linkerSysroot->_M_string_length;
  (linkerSysroot->_M_dataplus)._M_p = (pointer)paVar1;
  linkerSysroot->_M_string_length = 0;
  (linkerSysroot->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmRulePlaceholderExpander::cmRulePlaceholderExpander(
  std::map<std::string, std::string> compilers,
  std::map<std::string, std::string> variableMappings,
  std::string compilerSysroot, std::string linkerSysroot)
  : Compilers(std::move(compilers))
  , VariableMappings(std::move(variableMappings))
  , CompilerSysroot(std::move(compilerSysroot))
  , LinkerSysroot(std::move(linkerSysroot))
{
}